

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_reader.h
# Opt level: O3

ReadResult __thiscall
ximu::PacketReader::read<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
          (PacketReader *this,
          _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *begin,
          _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *end)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  PWMOutputData PVar4;
  char cVar5;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end_00;
  char *pcVar6;
  ReadResult RVar7;
  uint uVar8;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_b8;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_98;
  undefined1 auStack_78 [8];
  DateTimeData wdt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  
  wdt._seconds = 0;
  local_b8._M_cur = begin->_M_cur;
  local_b8._M_first = begin->_M_first;
  local_b8._M_last = begin->_M_last;
  local_b8._M_node = begin->_M_node;
  local_98._M_cur = end->_M_cur;
  local_98._M_first = end->_M_first;
  local_98._M_last = end->_M_last;
  local_98._M_node = end->_M_node;
  PacketEncoding::
  decodePacket<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_b8,&local_98,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             &wdt._seconds);
  sVar2 = wdt._seconds;
  cVar5 = '\0';
  pcVar6 = (char *)wdt._seconds;
  if (wdt._seconds != 0xffffffffffffffff) {
    do {
      cVar5 = cVar5 + *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != &cRamffffffffffffffff);
  }
  RVar7 = INVALID_CHECKSUM;
  if (cVar5 == cRamffffffffffffffff) {
    bVar1 = *(byte *)wdt._seconds;
    sVar3 = PacketSize(this,(uint)bVar1);
    RVar7 = INVALID_PACKET_SIZE;
    if (-sVar2 == sVar3) {
      RVar7 = NOT_IMPLEMENTED;
      uVar8 = bVar1 - 5;
      if (uVar8 < 0xc) {
        end_00._M_current =
             (uchar *)((long)&switchD_001066d8::switchdataD_001090f0 +
                      (long)(int)(&switchD_001066d8::switchdataD_001090f0)[uVar8]);
        switch((uint)bVar1) {
        case 5:
          PacketDeconstruction::
          deconstructWriteDateTimeData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((DateTimeData *)auStack_78,(PacketDeconstruction *)wdt._seconds,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )0x0,end_00);
          (*this->_vptr_PacketReader[2])(this,auStack_78);
          break;
        default:
          goto switchD_001066d8_caseD_6;
        case 9:
          PacketDeconstruction::
          deconstructCalInertialAndMagneticData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((CalInertialAndMagneticData *)auStack_78,(PacketDeconstruction *)wdt._seconds,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )0x0,end_00);
          (*this->_vptr_PacketReader[1])(this,auStack_78);
          break;
        case 10:
          _auStack_78 = (EightChannelData<short>)
                        PacketDeconstruction::
                        deconstructQuaternionData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )wdt._seconds,
                                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )0x0);
          (**this->_vptr_PacketReader)(this);
          break;
        case 0xb:
          DigitalIOData::DigitalIOData
                    ((DigitalIOData *)auStack_78,*(uchar *)(wdt._seconds + 1),
                     *(uchar *)(wdt._seconds + 2));
          (*this->_vptr_PacketReader[3])(this,auStack_78);
          break;
        case 0xc:
          _auStack_78 = (EightChannelData<short>)
                        PacketDeconstruction::
                        deconstructRawAnalogueInputData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )wdt._seconds,
                                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )0x0);
          (*this->_vptr_PacketReader[8])(this);
          break;
        case 0xd:
          PacketDeconstruction::
          deconstructCalAnalogueInputData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((CalAnalogueInputData *)auStack_78,(PacketDeconstruction *)wdt._seconds,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )0x0,end_00);
          (*this->_vptr_PacketReader[7])(this,auStack_78);
          break;
        case 0xe:
          PVar4 = PacketDeconstruction::
                  deconstructPWMOutputData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )wdt._seconds,
                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )0x0);
          auStack_78._0_2_ = PVar4.super_FourChannelData<unsigned_short>._channelA;
          auStack_78._2_2_ = PVar4.super_FourChannelData<unsigned_short>._channelB;
          auStack_78._4_2_ = PVar4.super_FourChannelData<unsigned_short>._channelC;
          auStack_78._6_2_ = PVar4.super_FourChannelData<unsigned_short>._channelD;
          (*this->_vptr_PacketReader[6])(this);
          break;
        case 0xf:
          PacketDeconstruction::
          deconstructRawAdxl345BusData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((RawAdxl345BusData *)auStack_78,(PacketDeconstruction *)wdt._seconds,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )0x0,end_00);
          (*this->_vptr_PacketReader[5])(this,auStack_78);
          break;
        case 0x10:
          PacketDeconstruction::
          deconstructCalAdxl345BusData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((CalAdxl345BusData *)auStack_78,(PacketDeconstruction *)wdt._seconds,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )0x0,end_00);
          (*this->_vptr_PacketReader[4])(this,auStack_78);
        }
        RVar7 = OKE;
      }
    }
  }
switchD_001066d8_caseD_6:
  if (wdt._seconds != 0) {
    operator_delete((void *)wdt._seconds);
  }
  return RVar7;
}

Assistant:

ReadResult read(InputIterator begin, InputIterator end) {
    // working buffer
    std::vector<unsigned char> buffer;

    // decode packet
    PacketEncoding::decodePacket(begin, end, std::back_inserter(buffer));

    // test checksum
    auto checksum = PacketConstruction::checksum(
        buffer.begin(), buffer.end() - 1);

    if (checksum != buffer.back())
      return ReadResult::INVALID_CHECKSUM;

    // get the header
    auto header = static_cast<ximu::PacketHeaders>(buffer[0]);

    // packets have an associated size
    if (buffer.size() != PacketSize(header))
      return ReadResult::INVALID_PACKET_SIZE;

    // todo @aukedirk make use of enum returned
    switch (header) {
      case PacketHeaders::CAL_INERTIAL_AND_MAGNETIC_DATA:
      {
	auto cimd = PacketDeconstruction::deconstructCalInertialAndMagneticData(
          buffer.begin(), buffer.end());
        recievedCalInertialAndMagneticData(cimd);  
	return ReadResult::OKE;
      }
      case PacketHeaders::QUATERNION_DATA:
      {
	auto qd = PacketDeconstruction::deconstructQuaternionData(
		      buffer.begin(),buffer.end());
	recievedQuaternionData(qd);
	return ReadResult::OKE;
      }
      case PacketHeaders::WRITE_DATETIME:
      {
	auto wdt = PacketDeconstruction::deconstructWriteDateTimeData(
	  buffer.begin(),buffer.end());
	recievedDateTimeData(wdt);
	return ReadResult::OKE;
      }
      case PacketHeaders::DIGITAL_IO_DATA:
      {
	auto did = PacketDeconstruction::deconstructDigitalIOData(
	  buffer.begin(),buffer.end());
	recievedDigitalIOData(did);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::CAL_ADXL_345_BUS_DATA:
      {
	auto adxl = PacketDeconstruction::deconstructCalAdxl345BusData
	  (buffer.begin(),buffer.end());
	recievedCalAdxl345BusData(adxl);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::RAW_ADXL_345_BUS_DATA:
      {
	auto adxl = PacketDeconstruction::deconstructRawAdxl345BusData
	  (buffer.begin(),buffer.end());
	recievedRawAdxl345BusData(adxl);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::PWM_OUTPUT_DATA:
      {
	auto pwm = PacketDeconstruction::deconstructPWMOutputData
	(buffer.begin(),buffer.end());
	recievedPWMOutputData(pwm);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::CAL_ANALOGUE_INPUT_DATA:
      {
	auto anl = PacketDeconstruction::deconstructCalAnalogueInputData
	(buffer.begin(),buffer.end());
	recievedCalAnalogueInputData(anl);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::RAW_ANALOGUE_INPUT_DATA:
      {
	auto anl = PacketDeconstruction::deconstructRawAnalogueInputData
	(buffer.begin(),buffer.end());
	recievedRawAnalogueInputData(anl);
	return ReadResult::OKE;
      }
    }
    return ReadResult::NOT_IMPLEMENTED;
  }